

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall
llvm::detail::DoubleAPFloat::DoubleAPFloat
          (DoubleAPFloat *this,fltSemantics *S,APFloat *First,APFloat *Second)

{
  IEEEFloat *this_00;
  undefined8 *puVar1;
  
  this->Semantics = S;
  puVar1 = (undefined8 *)operator_new__(0x48);
  *puVar1 = 2;
  this_00 = (IEEEFloat *)(puVar1 + 2);
  if ((First->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
    DoubleAPFloat((DoubleAPFloat *)this_00,(DoubleAPFloat *)&(First->U).IEEE);
  }
  else {
    IEEEFloat::IEEEFloat(this_00,&(First->U).IEEE);
  }
  if ((Second->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
    DoubleAPFloat((DoubleAPFloat *)(puVar1 + 6),(DoubleAPFloat *)&(Second->U).IEEE);
  }
  else {
    IEEEFloat::IEEEFloat((IEEEFloat *)(puVar1 + 6),&(Second->U).IEEE);
  }
  (this->Floats)._M_t.super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = (APFloat *)(puVar1 + 1);
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xf28,
                  "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, APFloat &&, APFloat &&)"
                 );
  }
  if (this_00->semantics != (fltSemantics *)semIEEEdouble) {
    __assert_fail("&Floats[0].getSemantics() == &semIEEEdouble",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xf29,
                  "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, APFloat &&, APFloat &&)"
                 );
  }
  if ((undefined1 *)puVar1[6] == semIEEEdouble) {
    return;
  }
  __assert_fail("&Floats[1].getSemantics() == &semIEEEdouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf2a,
                "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, APFloat &&, APFloat &&)"
               );
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const fltSemantics &S, APFloat &&First,
                             APFloat &&Second)
    : Semantics(&S),
      Floats(new APFloat[2]{std::move(First), std::move(Second)}) {
  assert(Semantics == &semPPCDoubleDouble);
  assert(&Floats[0].getSemantics() == &semIEEEdouble);
  assert(&Floats[1].getSemantics() == &semIEEEdouble);
}